

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

void __thiscall
JsUtil::
BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
         *this)

{
  Type *addr;
  int iVar1;
  code *pcVar2;
  uint newSize;
  Type TVar3;
  int *piVar4;
  bool bVar5;
  uint uVar6;
  undefined4 *puVar7;
  uint bucketCount;
  long lVar8;
  long lVar9;
  Type local_40;
  int *newBuckets;
  EntryType *newEntries;
  
  newSize = this->count * 2;
  bucketCount = 4;
  if (4 < newSize) {
    if ((int)newSize < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SizePolicy.h"
                         ,0x32,"(minCapacity_t <= ((int32_t)(((uint32_t)~((uint32_t)0)) >> 1)))",
                         "the next higher power of 2  must fit in uint32");
      if (!bVar5) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    if (((int)newSize < 1) || (bucketCount = newSize, (newSize + 0x7fffffff & newSize) != 0)) {
      iVar1 = 0x1f;
      if (newSize != 0) {
        for (; newSize >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      bucketCount = 1 << (-((byte)iVar1 ^ 0x1f) & 0x1f);
    }
  }
  local_40.ptr = (int *)0x0;
  newBuckets = (int *)0x0;
  addr = &this->entries;
  if (bucketCount == this->bucketCount) {
    newBuckets = (int *)AllocateEntries(this,newSize,true);
    Memory::
    CopyArray<Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry<Memory::WriteBarrierPtr<Js::PropertyRecord_const>,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>>,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator>
              ((Entry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                *)newBuckets,(long)(int)newSize,(this->entries).ptr,(long)this->count);
    DeleteEntries(this,(this->entries).ptr,this->size);
    piVar4 = newBuckets;
    Memory::Recycler::WBSetBit((char *)addr);
    (this->entries).ptr =
         (Entry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
          *)piVar4;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    this->size = newSize;
    this->modFunctionIndex = 0x4b;
  }
  else {
    Allocate(this,&local_40.ptr,(EntryType **)&newBuckets,bucketCount,newSize);
    Memory::
    CopyArray<Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry<Memory::WriteBarrierPtr<Js::PropertyRecord_const>,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>>,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator>
              ((Entry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                *)newBuckets,(long)(int)newSize,(this->entries).ptr,(long)this->count);
    this->modFunctionIndex = 0x4b;
    if (0 < this->count) {
      lVar9 = 4;
      lVar8 = 0;
      do {
        if (-2 < *(int *)((long)newBuckets + lVar9)) {
          uVar6 = GetBucket(*(int *)(*(long *)((long)newBuckets + lVar9 + 4) + 0xc) * 2 + 1,
                            bucketCount,this->modFunctionIndex);
          *(int *)((long)newBuckets + lVar9) = local_40.ptr[(int)uVar6];
          local_40.ptr[(int)uVar6] = (int)lVar8;
        }
        lVar8 = lVar8 + 1;
        lVar9 = lVar9 + 0x10;
      } while (lVar8 < this->count);
    }
    DeleteBuckets(this,(this->buckets).ptr,this->bucketCount);
    DeleteEntries(this,(this->entries).ptr,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,newSize,newSize - this->size);
    }
    TVar3.ptr = local_40.ptr;
    Memory::Recycler::WBSetBit((char *)this);
    (this->buckets).ptr = TVar3.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
    piVar4 = newBuckets;
    Memory::Recycler::WBSetBit((char *)addr);
    (this->entries).ptr =
         (Entry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
          *)piVar4;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    this->bucketCount = bucketCount;
    this->size = newSize;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }